

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void down_sample_uv(int uiCWidth,int uiCHeight,int bitDept,pel *pSrc,int uiSrcStride,pel *pDst,
                   int uiDstStride)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  pel pVar4;
  ulong uVar5;
  pel pVar6;
  int iVar7;
  long lVar8;
  
  uVar5 = 0;
  uVar3 = (ulong)(uint)uiCWidth;
  if (uiCWidth < 1) {
    uVar3 = uVar5;
  }
  if (uiCHeight < 1) {
    uiCHeight = 0;
  }
  for (; (int)uVar5 != uiCHeight; uVar5 = (ulong)((int)uVar5 + 1)) {
    lVar2 = 0;
    iVar1 = 1;
    for (lVar8 = 0; uVar3 * 4 != lVar8; lVar8 = lVar8 + 4) {
      iVar7 = (int)lVar8;
      if (lVar8 == 0) {
        pVar6 = (pel)((uint)pSrc[uiSrcStride] + (uint)*pSrc + 1 >> 1);
        pVar4 = (pel)((uint)pSrc[1] + (uint)pSrc[(long)uiSrcStride + 1] + 1 >> 1);
      }
      else {
        pVar6 = (pel)((uint)pSrc[uiSrcStride + -2 + iVar7] + (uint)pSrc[uiSrcStride + iVar7 + 2] +
                      (uint)pSrc[iVar7 + -2] + (uint)pSrc[iVar7 + 2] +
                      ((uint)pSrc[uiSrcStride + iVar7] + (uint)pSrc[iVar7]) * 2 + 4 >> 3);
        pVar4 = (pel)((uint)pSrc[iVar7 + uiSrcStride + -1] + (uint)pSrc[uiSrcStride + iVar7 + 3] +
                      (uint)pSrc[iVar7 + -1] + (uint)pSrc[iVar7 + 3] +
                      ((uint)pSrc[uiSrcStride + iVar7 + 1] + (uint)pSrc[iVar7 + 1]) * 2 + 4 >> 3);
      }
      pDst[lVar2 >> 0x20] = pVar6;
      pDst[iVar1] = pVar4;
      iVar1 = iVar1 + 2;
      lVar2 = lVar2 + 0x200000000;
    }
    pDst = pDst + uiDstStride;
    pSrc = pSrc + uiSrcStride * 2;
  }
  return;
}

Assistant:

void down_sample_uv(int uiCWidth, int uiCHeight, int bitDept, pel *pSrc, int uiSrcStride, pel *pDst, int uiDstStride)
{
    int val_u, val_v;

    for (int j = 0; j < uiCHeight; j++)
    {
        for (int i = 0; i < uiCWidth; i++)
        {
            int i2 = i << 1;
            int i4 = i << 2;
            if (i == 0)
            {
                val_u = (pSrc[i4] + pSrc[i4 + uiSrcStride] + 1) >> 1;
                val_v = (pSrc[i4 + 1] + pSrc[i4 + 1 + uiSrcStride] + 1) >> 1;
            }
            else
            {
                val_u = (pSrc[i4] * 2 + pSrc[i4 + 2] + pSrc[i4 - 2] + pSrc[i4 + uiSrcStride] * 2
                         + pSrc[i4 + uiSrcStride + 2] + pSrc[i4 + uiSrcStride - 2] + 4) >> 3;
                val_v = (pSrc[i4 + 1] * 2 + pSrc[i4 + 3] + pSrc[i4 - 1] + pSrc[i4 + 1 + uiSrcStride] * 2
                    + pSrc[i4 + uiSrcStride + 3] + pSrc[i4 + uiSrcStride - 1] + 4) >> 3;
            }

            pDst[i2    ] = val_u;
            pDst[i2 + 1] = val_v;
        }
        pDst += uiDstStride;
        pSrc += uiSrcStride * 2;
    }
}